

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::add<>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,WeightedOption weightedOption)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  ulong local_30;
  size_t i;
  FeatureOptions<wasm::Type> *this_local;
  WeightedOption weightedOption_local;
  FeatureSet feature_local;
  
  weightedOption_local.option.id = weightedOption.weight;
  this_local = (FeatureOptions<wasm::Type> *)weightedOption.option.id;
  weightedOption_local.weight._4_4_ = feature.features;
  for (local_30 = 0; local_30 < weightedOption_local.option.id; local_30 = local_30 + 1) {
    this_00 = std::
              map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
              ::operator[](&this->options,(key_type *)((long)&weightedOption_local.weight + 4));
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              (this_00,(value_type *)&this_local);
  }
  pFVar1 = add(this,weightedOption_local.weight._4_4_);
  return pFVar1;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }